

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

int __thiscall duckdb_re2::Regexp::NumCaptures(Regexp *this)

{
  int iVar1;
  NumCapturesWalker w;
  undefined1 local_78 [96];
  int iStack_18;
  
  local_78._0_8_ = &PTR__Walker_019bbe60;
  local_78._8_8_ = (_Map_pointer)0x0;
  local_78._16_8_ = 0;
  local_78._24_8_ = (_Elt_pointer)0x0;
  local_78._32_8_ = (_Elt_pointer)0x0;
  local_78._40_8_ = (_Elt_pointer)0x0;
  local_78._48_8_ = (_Map_pointer)0x0;
  local_78._56_8_ = (_Elt_pointer)0x0;
  local_78._64_8_ = (_Elt_pointer)0x0;
  local_78._72_8_ = (_Elt_pointer)0x0;
  local_78._80_8_ = (_Map_pointer)0x0;
  std::_Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>::
  _M_initialize_map((_Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                     *)(local_78 + 8),0);
  local_78[0x58] = false;
  local_78._0_8_ = &PTR__Walker_019bbdf8;
  stack0xffffffffffffffe4 = 1000000;
  Walker<int>::WalkInternal((Walker<int> *)local_78,this,0,true);
  iVar1 = iStack_18;
  Walker<int>::~Walker((Walker<int> *)local_78);
  return iVar1;
}

Assistant:

int Regexp::NumCaptures() {
  NumCapturesWalker w;
  w.Walk(this, 0);
  return w.ncapture();
}